

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

void use_skill(int skill,int degree)

{
  unsigned_short *puVar1;
  boolean bVar2;
  int iVar3;
  
  if ((skill != 0) && (u.weapon_skills[skill].skill != '\0')) {
    bVar2 = can_advance(skill,'\0');
    iVar3 = skill_crosstrain_bonus(skill);
    puVar1 = &u.weapon_skills[skill].advance;
    *puVar1 = *puVar1 + (short)iVar3 * (short)degree;
    if (bVar2 == '\0') {
      bVar2 = can_advance(skill,'\0');
      if (bVar2 != '\0') {
        give_may_advance_msg(skill);
        return;
      }
    }
  }
  return;
}

Assistant:

void use_skill(int skill, int degree)
{
    boolean advance_before;

    if (skill != P_NONE && !P_RESTRICTED(skill)) {
	advance_before = can_advance(skill, FALSE);
	P_ADVANCE(skill) += degree * skill_crosstrain_bonus(skill);
	if (!advance_before && can_advance(skill, FALSE))
	    give_may_advance_msg(skill);
    }
}